

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O2

void __thiscall
embree::Application::parseCommandLine
          (Application *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  Ref<embree::ParseStream> local_18;
  
  local_18 = (Ref<embree::ParseStream>)cin->ptr;
  if (local_18.ptr != (ParseStream *)0x0) {
    (*((local_18.ptr)->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])();
  }
  CommandLineParser::parseCommandLine(&this->commandLineParser,&local_18,path);
  if (local_18.ptr != (ParseStream *)0x0) {
    (*((local_18.ptr)->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[3])();
  }
  return;
}

Assistant:

void parseCommandLine(Ref<ParseStream> cin, const FileName& path) {
      commandLineParser.parseCommandLine(cin, path);
    }